

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O1

int __thiscall
TPZStructMatrix::ComputeElementColors(TPZStructMatrix *this,TPZVec<int> *elementcolors)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  ulong j;
  ulong uVar8;
  int64_t iVar9;
  bool bVar10;
  TPZVec<long> elgraphindex;
  TPZGenMatrix<long> domain;
  TPZStack<long,_10> elgraph;
  long local_120;
  long local_108;
  long local_100;
  TPZVec<long> local_f8;
  long local_d8;
  long local_d0;
  ulong local_c8;
  TPZVec<int> *local_c0;
  TPZGenMatrix<long> local_b8;
  TPZManVector<long,_10> local_a0;
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_a0);
  local_f8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  local_f8.fStore = (long *)0x0;
  local_f8.fNElements = 0;
  local_f8.fNAlloc = 0;
  if ((this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    TPZCompMesh::ComputeElGraph(this->fMesh,(TPZStack<long,_10> *)&local_a0,&local_f8);
  }
  else {
    TPZCompMesh::ComputeElGraph
              (this->fMesh,(TPZStack<long,_10> *)&local_a0,&local_f8,&this->fMaterialIds);
  }
  TPZGenMatrix<long>::TPZGenMatrix
            (&local_b8,(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements,10
            );
  iVar9 = local_f8.fNElements;
  local_d0 = local_f8.fNElements + -1;
  (*elementcolors->_vptr_TPZVec[4])(elementcolors);
  local_108 = CONCAT44(local_108._4_4_,0xffffffff);
  iVar3 = 0;
  TPZVec<int>::Fill(elementcolors,(int *)&local_108,0,-1);
  local_100 = 0;
  local_d8 = iVar9;
  local_c0 = elementcolors;
  do {
    uVar8 = 0;
    if (1 < iVar9) {
      local_120 = 0;
      do {
        j = 0;
        local_c8 = uVar8;
        do {
          lVar1 = local_f8.fStore[local_120 + 1];
          bVar2 = true;
          if ((int)local_f8.fStore[local_120] < lVar1) {
            bVar2 = true;
            lVar7 = (long)(int)local_f8.fStore[local_120];
            do {
              lVar6 = lVar7 + 1;
              iVar9 = local_a0.super_TPZVec<long>.fStore[lVar7];
              plVar5 = TPZGenMatrix<long>::operator()(&local_b8,iVar9,j);
              if (*plVar5 != 0) {
                bVar2 = false;
                break;
              }
              plVar5 = TPZGenMatrix<long>::operator()(&local_b8,iVar9,j);
              *plVar5 = 1;
              lVar7 = lVar6;
            } while (lVar6 < lVar1);
          }
          if (bVar2) {
            iVar4 = (int)local_100 + (int)j;
            local_c0->fStore[local_120] = iVar4;
            if (iVar3 < iVar4) {
              iVar3 = iVar4;
            }
          }
          bVar10 = j < 9;
          j = j + 1;
        } while (bVar10 && !bVar2);
        uVar8 = local_c8 & 0xff;
        if (!bVar2) {
          uVar8 = 1;
        }
        local_120 = local_120 + 1;
        iVar9 = local_d8;
      } while (local_120 != local_d0);
    }
    local_108 = 0;
    TPZGenMatrix<long>::Fill(&local_b8,&local_108);
    local_100 = local_100 + 10;
    if ((uVar8 & 1) == 0) {
      TPZGenMatrix<long>::~TPZGenMatrix(&local_b8);
      local_f8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
      if (local_f8.fStore != (long *)0x0) {
        operator_delete__(local_f8.fStore);
      }
      TPZManVector<long,_10>::~TPZManVector(&local_a0);
      return iVar3;
    }
  } while( true );
}

Assistant:

int TPZStructMatrix::ComputeElementColors(TPZVec<int> &elementcolors)
{
    TPZStack<int64_t> elgraph;
    TPZVec<int64_t> elgraphindex;
    if(!fMaterialIds.size())
    {
        fMesh->ComputeElGraph(elgraph, elgraphindex);
    }
    else
    {
        fMesh->ComputeElGraph(elgraph, elgraphindex, fMaterialIds);
    }
    int64_t nconnects = fMesh->NConnects();
    const int color_stored = 10;
    TPZGenMatrix<int64_t> domain(nconnects,color_stored);
    int64_t nel = elgraphindex.size()-1;
    elementcolors.resize(nel);
    elementcolors.Fill(-1);
    bool element_not_colored = true;
    int highest_color = 0;
    int min_color = 0;
    int max_color = min_color+color_stored;
    while(element_not_colored)
    {
        element_not_colored = false;
        for (int64_t el = 0; el<nel; el++) {
            int icolor;
            bool color_found = true;
            for(int icolor = 0; icolor<color_stored; icolor++)
            {
                color_found = true;
                int64_t firstnode = elgraphindex[el];
                int64_t lastnode = elgraphindex[el+1];
                for (int inod = firstnode; inod < lastnode; inod++) {
                    int64_t ic = elgraph[inod];
                    if(domain(ic,icolor) != 0)
                    {
                        color_found = false;
                        break;
                    }
                    domain(ic,icolor) = 1;
                }
                if(color_found == true)
                {
                    elementcolors[el] = min_color+icolor;
                    if(min_color+icolor > highest_color) highest_color = min_color+icolor;
                    break;
                }
            }
            // the element didn't fit any color, the loop will have to be executed again
            if(!color_found) element_not_colored = true;
        }
        min_color += color_stored;
        max_color += color_stored;
        domain.Fill(0);
    }
    return highest_color;
}